

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O1

void __thiscall AddrManImpl::SwapRandom(AddrManImpl *this,uint nRndPos1,uint nRndPos2)

{
  long lVar1;
  pointer plVar2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  __buckets_ptr pp_Var5;
  __node_base_ptr p_Var6;
  ulong uVar7;
  _Hash_node_base *p_Var8;
  ulong uVar9;
  __node_base_ptr p_Var10;
  __hash_code __code;
  __node_base_ptr p_Var11;
  _Hash_node_base *p_Var12;
  ulong uVar13;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (nRndPos1 != nRndPos2) {
    uVar9 = (ulong)nRndPos1;
    plVar2 = (this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = (long)(this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)plVar2 >> 3;
    if ((uVar7 <= uVar9) || (uVar13 = (ulong)nRndPos2, uVar7 <= uVar13)) {
      __assert_fail("nRndPos1 < vRandom.size() && nRndPos2 < vRandom.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                    ,0x1b7,"void AddrManImpl::SwapRandom(unsigned int, unsigned int) const");
    }
    p_Var3 = (_Hash_node_base *)plVar2[uVar9];
    p_Var4 = (_Hash_node_base *)plVar2[uVar13];
    pp_Var5 = (this->mapInfo)._M_h._M_buckets;
    uVar7 = (this->mapInfo)._M_h._M_bucket_count;
    p_Var6 = pp_Var5[(ulong)p_Var3 % uVar7];
    p_Var10 = (__node_base_ptr)0x0;
    if ((p_Var6 != (__node_base_ptr)0x0) &&
       (p_Var11 = p_Var6->_M_nxt, p_Var10 = p_Var6, p_Var3 != p_Var11[1]._M_nxt)) {
      while (p_Var12 = p_Var11->_M_nxt, p_Var12 != (_Hash_node_base *)0x0) {
        p_Var10 = (__node_base_ptr)0x0;
        if (((ulong)p_Var12[1]._M_nxt % uVar7 != (ulong)p_Var3 % uVar7) ||
           (p_Var10 = p_Var11, p_Var11 = p_Var12, p_Var3 == p_Var12[1]._M_nxt)) goto LAB_0085bf14;
      }
      p_Var10 = (__node_base_ptr)0x0;
    }
LAB_0085bf14:
    if (p_Var10 == (__node_base_ptr)0x0) {
      p_Var12 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var12 = p_Var10->_M_nxt;
    }
    p_Var6 = pp_Var5[(ulong)p_Var4 % uVar7];
    p_Var10 = (__node_base_ptr)0x0;
    if ((p_Var6 != (__node_base_ptr)0x0) &&
       (p_Var11 = p_Var6->_M_nxt, p_Var10 = p_Var6, p_Var4 != p_Var11[1]._M_nxt)) {
      while (p_Var8 = p_Var11->_M_nxt, p_Var8 != (_Hash_node_base *)0x0) {
        p_Var10 = (__node_base_ptr)0x0;
        if (((ulong)p_Var8[1]._M_nxt % uVar7 != (ulong)p_Var4 % uVar7) ||
           (p_Var10 = p_Var11, p_Var11 = p_Var8, p_Var4 == p_Var8[1]._M_nxt)) goto LAB_0085bf73;
      }
      p_Var10 = (__node_base_ptr)0x0;
    }
LAB_0085bf73:
    if (p_Var10 == (__node_base_ptr)0x0) {
      p_Var8 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var8 = p_Var10->_M_nxt;
    }
    if (p_Var12 == (_Hash_node_base *)0x0) {
      __assert_fail("it_1 != mapInfo.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                    ,0x1be,"void AddrManImpl::SwapRandom(unsigned int, unsigned int) const");
    }
    if (p_Var8 == (_Hash_node_base *)0x0) {
      __assert_fail("it_2 != mapInfo.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                    ,0x1bf,"void AddrManImpl::SwapRandom(unsigned int, unsigned int) const");
    }
    *(uint *)((long)&p_Var12[0x11]._M_nxt + 4) = nRndPos2;
    *(uint *)((long)&p_Var8[0x11]._M_nxt + 4) = nRndPos1;
    plVar2[uVar9] = (long)p_Var4;
    plVar2[uVar13] = (long)p_Var3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void AddrManImpl::SwapRandom(unsigned int nRndPos1, unsigned int nRndPos2) const
{
    AssertLockHeld(cs);

    if (nRndPos1 == nRndPos2)
        return;

    assert(nRndPos1 < vRandom.size() && nRndPos2 < vRandom.size());

    nid_type nId1 = vRandom[nRndPos1];
    nid_type nId2 = vRandom[nRndPos2];

    const auto it_1{mapInfo.find(nId1)};
    const auto it_2{mapInfo.find(nId2)};
    assert(it_1 != mapInfo.end());
    assert(it_2 != mapInfo.end());

    it_1->second.nRandomPos = nRndPos2;
    it_2->second.nRandomPos = nRndPos1;

    vRandom[nRndPos1] = nId2;
    vRandom[nRndPos2] = nId1;
}